

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_compressCTable_internal
                 (BYTE *ostart,BYTE *op,BYTE *oend,void *src,size_t srcSize,
                 HUF_nbStreams_e nbStreams,HUF_CElt *CTable,int flags)

{
  ulong uVar1;
  ulong uVar2;
  
  if (nbStreams == HUF_singleStream) {
    uVar1 = HUF_compress1X_usingCTable_internal(op,(long)oend - (long)op,src,srcSize,CTable,flags);
  }
  else {
    uVar1 = HUF_compress4X_usingCTable_internal(op,(long)oend - (long)op,src,srcSize,CTable,flags);
  }
  if (uVar1 < 0xffffffffffffff89) {
    if (uVar1 == 0) {
      uVar1 = 0;
    }
    else {
      uVar2 = (long)(op + uVar1) - (long)ostart;
      if (op + uVar1 < ostart) {
        __assert_fail("op >= ostart",
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x3f8f,
                      "size_t HUF_compressCTable_internal(BYTE *const, BYTE *, BYTE *const, const void *, size_t, HUF_nbStreams_e, const HUF_CElt *, const int)"
                     );
      }
      uVar1 = 0;
      if (uVar2 < srcSize - 1) {
        uVar1 = uVar2;
      }
    }
  }
  return uVar1;
}

Assistant:

static size_t HUF_compressCTable_internal(
                BYTE* const ostart, BYTE* op, BYTE* const oend,
                const void* src, size_t srcSize,
                HUF_nbStreams_e nbStreams, const HUF_CElt* CTable, const int flags)
{
    size_t const cSize = (nbStreams==HUF_singleStream) ?
                         HUF_compress1X_usingCTable_internal(op, (size_t)(oend - op), src, srcSize, CTable, flags) :
                         HUF_compress4X_usingCTable_internal(op, (size_t)(oend - op), src, srcSize, CTable, flags);
    if (HUF_isError(cSize)) { return cSize; }
    if (cSize==0) { return 0; }   /* uncompressible */
    op += cSize;
    /* check compressibility */
    assert(op >= ostart);
    if ((size_t)(op-ostart) >= srcSize-1) { return 0; }
    return (size_t)(op-ostart);
}